

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O3

Qiniu_Error Qiniu_Qetag_Reset(_Qiniu_Qetag_Context *ctx)

{
  Qiniu_Error QVar1;
  Qiniu_Digest *pQVar2;
  Qiniu_Error QVar3;
  
  pQVar2 = Qiniu_Digest_New(QINIU_DIGEST_TYPE_SHA1);
  ctx->sha1Digest = pQVar2;
  if (pQVar2 == (Qiniu_Digest *)0x0) {
    QVar1.message = "openssl internal error";
    QVar1._0_8_ = 9999;
  }
  else {
    ctx->blkUnused = ctx->blkElementCount;
    ctx->blkBegin = 0;
    ctx->blkEnd = 0;
    ctx->blkCount = 0;
    ctx->blk = (Qiniu_Qetag_Block *)0x0;
    QVar3 = Qiniu_Qetag_allocateBlock(ctx,&ctx->blk);
    QVar1.message = "ok";
    QVar1._0_8_ = QVar3._0_8_;
    if (QVar3.code != 200) {
      QVar1 = QVar3;
    }
  }
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_Qetag_Reset(struct _Qiniu_Qetag_Context * ctx)
{
    Qiniu_Error err;

	ctx->sha1Digest = Qiniu_Digest_New(QINIU_DIGEST_TYPE_SHA1);
	if (ctx->sha1Digest == NULL) {
		err.code = 9999;
		err.message = "openssl internal error";
		return err;
	}

    ctx->blkCount   = 0;
    ctx->blkUnused  = ctx->blkElementCount;
    ctx->blkBegin   = 0;
    ctx->blkEnd     = 0;
    ctx->blk        = NULL;

    err = Qiniu_Qetag_allocateBlock(ctx, &ctx->blk);
    if (err.code != 200) {
        return err;
    }

    err.code = 200;
    err.message = "ok";
    return err;
}